

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getdelegate(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType SVar1;
  SQVM *in_RDI;
  SQObjectPtr *self;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  HSQUIRRELVM in_stack_ffffffffffffffb0;
  SQObjectPtr local_30;
  SQObjectPtr *local_20;
  SQVM *local_10;
  SQRESULT local_8;
  
  local_10 = in_RDI;
  local_20 = stack_get(in_stack_ffffffffffffffb0,(SQInteger)in_stack_ffffffffffffffa8);
  SVar1 = (local_20->super_SQObject)._type;
  if ((SVar1 == OT_TABLE) || (SVar1 == OT_USERDATA)) {
    if ((((local_20->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate == (SQTable *)0x0)
    {
      SQVM::PushNull((SQVM *)0x10aeed);
    }
    else {
      SQObjectPtr::SQObjectPtr(&local_30,((local_20->super_SQObject)._unVal.pDelegable)->_delegate);
      SQVM::Push(local_10,in_stack_ffffffffffffffa8);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_10);
    }
    local_8 = 0;
  }
  else {
    local_8 = sq_throwerror(in_stack_ffffffffffffffb0,(SQChar *)in_stack_ffffffffffffffa8);
  }
  return local_8;
}

Assistant:

SQRESULT sq_getdelegate(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &self=stack_get(v,idx);
    switch(sq_type(self)){
    case OT_TABLE:
    case OT_USERDATA:
        if(!_delegable(self)->_delegate){
            v->PushNull();
            break;
        }
        v->Push(SQObjectPtr(_delegable(self)->_delegate));
        break;
    default: return sq_throwerror(v,_SC("wrong type")); break;
    }
    return SQ_OK;

}